

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void process_constructor(gvisitor_t *self,gravity_class_t *c,gnode_t *node)

{
  gravity_vm *vm;
  gravity_value_t value;
  uint16_t uVar1;
  uint32_t p1;
  uint32_t uVar2;
  ircode_t *piVar3;
  gravity_value_t gVar4;
  uint32_t local_224;
  uint32_t local_214;
  uint32_t local_204;
  uint32_t local_1f4;
  uint32_t local_1e4;
  uint32_t local_1d4;
  uint32_t temp;
  uint32_t dest2;
  uint32_t dest;
  uint16_t index_1;
  ircode_t *code_1;
  ircode_t *code2;
  ircode_t *code;
  uint16_t index;
  char local_148 [8];
  char name [256];
  gravity_function_t *super_init;
  gravity_class_s *pgStack_38;
  uint32_t ninit;
  gravity_class_t *super;
  gravity_function_t *constructor_function;
  gravity_function_t *internal_init_function;
  gnode_t *node_local;
  gravity_class_t *c_local;
  gvisitor_t *self_local;
  
  constructor_function = class_lookup_nosuper(c,"$init");
  super = (gravity_class_t *)class_lookup_nosuper(c,"init");
  for (pgStack_38 = c->superclass; pgStack_38 != (gravity_class_t *)0x0;
      pgStack_38 = pgStack_38->superclass) {
    name._248_8_ = class_lookup_nosuper(pgStack_38,"$init");
    if ((gravity_function_t *)name._248_8_ != (gravity_function_t *)0x0) {
      if (constructor_function == (gravity_function_t *)0x0) {
        piVar3 = ircode_create(1);
        constructor_function = gravity_function_new((gravity_vm *)0x0,"$init",1,0,0,piVar3);
      }
      snprintf(local_148,0x100,"%s%d","$init");
      gVar4.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)name._248_8_;
      gVar4.isa = *(gravity_class_t **)name._248_8_;
      gravity_class_bind(c,local_148,gVar4);
      gVar4 = gravity_string_to_value
                        (*(gravity_vm **)((long)self->data + 0x38),local_148,0xffffffff);
      uVar1 = gravity_function_cpool_add((gravity_vm *)0x0,constructor_function,gVar4);
      ircode_patch_init((ircode_t *)(constructor_function->field_9).field_0.bytecode,uVar1);
    }
  }
  if ((constructor_function != (gravity_function_t *)0x0) ||
     ((gravity_function_t *)super != (gravity_function_t *)0x0)) {
    if (constructor_function != (gravity_function_t *)0x0) {
      piVar3 = (ircode_t *)(constructor_function->field_9).field_0.bytecode;
      if (piVar3 == (ircode_t *)0x0) {
        report_error(self,node,"Invalid code context.");
        return;
      }
      if (node == (gnode_t *)0x0) {
        local_1d4 = 0;
      }
      else {
        local_1d4 = (node->token).lineno;
      }
      ircode_add(piVar3,RET0,0,0,0,local_1d4);
      if ((gravity_function_t *)super == (gravity_function_t *)0x0) {
        piVar3 = ircode_create(1);
        super = (gravity_class_t *)gravity_function_new((gravity_vm *)0x0,"init",1,0,2,piVar3);
        piVar3 = *(ircode_t **)((long)super + 0xa0);
        if (node == (gnode_t *)0x0) {
          local_1e4 = 0;
        }
        else {
          local_1e4 = (node->token).lineno;
        }
        ircode_add_skip(piVar3,local_1e4);
        if (node == (gnode_t *)0x0) {
          local_1f4 = 0;
        }
        else {
          local_1f4 = (node->token).lineno;
        }
        ircode_add_skip(piVar3,local_1f4);
        if (node == (gnode_t *)0x0) {
          local_204 = 0;
        }
        else {
          local_204 = (node->token).lineno;
        }
        ircode_add_skip(piVar3,local_204);
        if (node == (gnode_t *)0x0) {
          local_214 = 0;
        }
        else {
          local_214 = (node->token).lineno;
        }
        ircode_add_skip(piVar3,local_214);
        value.field_1.p = super;
        value.isa = super->isa;
        gravity_class_bind(c,"init",value);
      }
    }
    if (super != (gravity_class_t *)0x0) {
      piVar3 = (ircode_t *)super[1].gc.next;
      if (piVar3 == (ircode_t *)0x0) {
        report_error(self,node,"Invalid code context.");
        return;
      }
      if (node == (gnode_t *)0x0) {
        local_224 = 0;
      }
      else {
        local_224 = (node->token).lineno;
      }
      ircode_add(piVar3,RET,0,0,0,local_224);
      if (constructor_function != (gravity_function_t *)0x0) {
        vm = *(gravity_vm **)((long)self->data + 0x38);
        gVar4 = gravity_string_to_value((gravity_vm *)0x0,"$init",0xffffffff);
        uVar1 = gravity_function_cpool_add(vm,(gravity_function_t *)super,gVar4);
        p1 = ircode_register_push_temp(piVar3);
        ircode_set_index(0,piVar3,LOADK,p1,(uint)uVar1,0);
        ircode_set_index(1,piVar3,LOAD,p1,0,p1);
        uVar2 = ircode_register_push_temp(piVar3);
        ircode_set_index(2,piVar3,MOVE,uVar2,0,0);
        uVar2 = ircode_register_pop(piVar3);
        if (uVar2 == 0xffffffff) {
          fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x3dc,"process_constructor","Unexpected register error.");
          abort();
        }
        ircode_set_index(3,piVar3,CALL,p1,p1,1);
      }
    }
    if (constructor_function != (gravity_function_t *)0x0) {
      gravity_optimizer(constructor_function,false);
    }
    if (super != (gravity_class_t *)0x0) {
      gravity_optimizer((gravity_function_t *)super,false);
    }
  }
  if (((c->objclass != (gravity_class_t *)0x0) && (c->objclass->isa != (gravity_class_t *)0x0)) &&
     (c->objclass->isa != c->objclass->objclass)) {
    process_constructor(self,c->objclass,node);
  }
  return;
}

Assistant:

static void process_constructor (gvisitor_t *self, gravity_class_t *c, gnode_t *node) {
    DEBUG_CODEGEN("process_constructor");

    // $init is an internal function used to initialize instance variables to a default value
    // in case of subclasses USER is RESPONSIBLE to call super.init();
    // in case of subclasses COMPILER is RESPONSIBLE to create the appropriate $init call chain

    // check internal $init function
    gravity_function_t *internal_init_function = class_lookup_nosuper(c, CLASS_INTERNAL_INIT_NAME);

    // check for user constructor function
    gravity_function_t *constructor_function = class_lookup_nosuper(c, CLASS_CONSTRUCTOR_NAME);

    // build appropriate $init function
    gravity_class_t *super = c->superclass;
    uint32_t ninit = 2;
    while (super) {
        gravity_function_t *super_init = class_lookup_nosuper(super, CLASS_INTERNAL_INIT_NAME);
        if (super_init) {
            // copy super init code to internal_init code
            if (!internal_init_function) internal_init_function = gravity_function_new(NULL, CLASS_INTERNAL_INIT_NAME, 1, 0, 0, ircode_create(1));

            // build unique internal init name ($init2, $init3 and so on)
            char name[256];
            snprintf(name, sizeof(name), "%s%d", CLASS_INTERNAL_INIT_NAME, ninit++);

            // add new internal init to class and call it from main $init function
            // super_init should not be duplicated here because class hash table values are not freed (only keys are freed)
            gravity_class_bind(c, name, VALUE_FROM_OBJECT(super_init));
            uint16_t index = gravity_function_cpool_add(NULL, internal_init_function, VALUE_FROM_CSTRING(GET_VM(), name));
            ircode_patch_init((ircode_t *)internal_init_function->bytecode, index);
        }
        super = super->superclass;
    }

    // 4 cases to handle:

    // 1. internal_init and constuctor are not present, so nothing to do here
    if ((!internal_init_function) && (!constructor_function)) goto check_meta;

//    // 2. internal init is present and constructor is not used
//    if ((internal_init_function) && (!constructor_function)) {
//        // add a RET0 command
//        ircode_t *code = (ircode_t *)internal_init_function->bytecode;
//        ircode_add(code, RET0, 0, 0, 0);
//
//        // bind internal init as constructor
//        gravity_class_bind(c, CLASS_CONSTRUCTOR_NAME, VALUE_FROM_OBJECT(internal_init_function));
//        gravity_object_setenclosing((gravity_object_t *)internal_init_function, (gravity_object_t *)c);
//        goto process_funcs;
//    }

    // 3. internal init is present so constructor is mandatory
    if (internal_init_function) {
        // convert ircode to bytecode for $init special function and add a RET0 command
        ircode_t *code = (ircode_t *)internal_init_function->bytecode;
        if (!code) {report_error(self, node, "Invalid code context."); return;}
		ircode_add(code, RET0, 0, 0, 0, LINE_NUMBER(node));

        if (constructor_function == NULL) {
            constructor_function = gravity_function_new(NULL, CLASS_CONSTRUCTOR_NAME, 1, 0, 2, ircode_create(1));
            ircode_t *code2 = (ircode_t *)constructor_function->bytecode;
			ircode_add_skip(code2, LINE_NUMBER(node));	// LOADK
			ircode_add_skip(code2, LINE_NUMBER(node));	// LOAD
			ircode_add_skip(code2, LINE_NUMBER(node));	// MOVE
			ircode_add_skip(code2, LINE_NUMBER(node));	// CALL
            gravity_class_bind(c, CLASS_CONSTRUCTOR_NAME, VALUE_FROM_OBJECT(constructor_function));
        }
    }

    // 4. constructor is present so internal init is optional
    if (constructor_function) {
        // add an implicit RET 0 (RET self) to the end of the constructor
        ircode_t *code = (ircode_t *)constructor_function->bytecode;
        if (!code) {report_error(self, node, "Invalid code context."); return;}
		ircode_add(code, RET, 0, 0, 0, LINE_NUMBER(node));

        if (internal_init_function) {
            // if an internal init function is present ($init) then add a call to it as a first instruction
            uint16_t index = gravity_function_cpool_add(GET_VM(), constructor_function, VALUE_FROM_CSTRING(NULL, CLASS_INTERNAL_INIT_NAME));

            // load constant
            uint32_t dest = ircode_register_push_temp(code);
            ircode_set_index(0, code, LOADK, dest, index, 0);

            // load from lookup
            ircode_set_index(1, code, LOAD, dest, 0, dest);

            // prepare parameters
            uint32_t dest2 = ircode_register_push_temp(code);
            ircode_set_index(2, code, MOVE, dest2, 0, 0);
            uint32_t temp = ircode_register_pop(code);
            DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

            // execute call
            ircode_set_index(3, code, CALL, dest, dest, 1);
        }
    }

	if (internal_init_function) gravity_optimizer(internal_init_function, false);
	if (constructor_function) gravity_optimizer(constructor_function, false);

check_meta:
    // recursively process constructor but stop when object or class class is found, otherwise an infinite loop is triggered
    if ((c->objclass) && (c->objclass->isa) && (c->objclass->isa != c->objclass->objclass)) process_constructor(self, c->objclass, node);
}